

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::RenderFragmentStorageTexelBuffer::logSubmit
          (RenderFragmentStorageTexelBuffer *this,TestLog *log,size_t commandIndex)

{
  int iVar1;
  MessageBuilder *pMVar2;
  undefined4 extraout_var;
  char *local_1b8 [3];
  MessageBuilder local_1a0;
  size_t local_20;
  size_t commandIndex_local;
  TestLog *log_local;
  RenderFragmentStorageTexelBuffer *this_local;
  
  local_20 = commandIndex;
  commandIndex_local = (size_t)log;
  log_local = (TestLog *)this;
  tcu::TestLog::operator<<(&local_1a0,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_1a0,&local_20);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x13431a0);
  iVar1 = (*(this->super_RenderPassCommand)._vptr_RenderPassCommand[2])();
  local_1b8[0] = (char *)CONCAT44(extraout_var,iVar1);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1b8);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [40])" Render using buffer as storage buffer.");
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  return;
}

Assistant:

void RenderFragmentStorageTexelBuffer::logSubmit (TestLog& log, size_t commandIndex) const
{
	log << TestLog::Message << commandIndex << ":" << getName() << " Render using buffer as storage buffer." << TestLog::EndMessage;
}